

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool __thiscall Function_Template::form1_Shift(Function_Template *this,ShiftForm1 Shift)

{
  uint8_t value;
  bool bVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 in_XMM0_Qa;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 in_XMM3_Qb;
  Image output;
  Image input;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&input,value,0,0,&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  auVar9._0_8_ = (double)(input._width >> 2);
  auVar9._8_8_ = in_XMM0_Qa;
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar3 = vorpd_avx512vl(auVar9,auVar3);
  dVar5 = Unit_Test::randomFloatValue<double>(auVar3._0_8_,auVar9._0_8_,1.0);
  iVar2 = rand();
  auVar7._0_8_ = (double)(iVar2 % 100);
  auVar7._8_8_ = in_XMM3_Qb;
  auVar3 = vfmadd132sd_fma(auVar7,ZEXT816(0) << 0x40,ZEXT816(0x3f847ae147ae147b));
  auVar10._0_8_ = (double)(input._height >> 2);
  auVar10._8_8_ = in_XMM3_Qb;
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar4 = vorpd_avx512vl(auVar10,auVar4);
  dVar6 = Unit_Test::randomFloatValue<double>(auVar4._0_8_,auVar10._0_8_,1.0);
  iVar2 = rand();
  auVar8._0_8_ = (double)(iVar2 % 100);
  auVar8._8_8_ = in_XMM3_Qb;
  auVar4 = vfmadd132sd_fma(auVar8,ZEXT816(0) << 0x40,ZEXT816(0x3f847ae147ae147b));
  (*(code *)this)(auVar3._0_8_ + dVar5,auVar4._0_8_ + dVar6,&output,&input);
  bVar1 = Unit_Test::verifyImage(&output,value);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  return bVar1;
}

Assistant:

bool form1_Shift(ShiftForm1 Shift)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        const double shiftX = randomFloatValue<double>( -static_cast<double>( input.width()  / 4 ), input.width() / 4 , 1 ) + randomFloatValue<double>( 0, 1, 0.01 );
        const double shiftY = randomFloatValue<double>( -static_cast<double>( input.height() / 4 ), input.height() / 4, 1 ) + randomFloatValue<double>( 0, 1, 0.01 );

        const PenguinV_Image::Image output = Shift( input, shiftX, shiftY );

        return verifyImage( output, intensity );
    }